

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

Matrix_Sparse * __thiscall
Disa::Matrix_Sparse::matrix_arithmetic<true>(Matrix_Sparse *this,Matrix_Sparse *other)

{
  pointer puVar1;
  pointer puVar2;
  source_location *psVar3;
  value_type vVar4;
  iterator *piVar5;
  bool bVar6;
  Matrix_Sparse *pMVar7;
  ostream *poVar8;
  source_location *location;
  long lVar9;
  pointer pvVar10;
  unsigned_long uVar11;
  long lVar12;
  double *pdVar13;
  const_iterator cVar14;
  value_type vVar15;
  undefined1 local_1e8 [32];
  iterator local_1c8;
  undefined1 local_1a8 [40];
  Matrix_Sparse *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  iterator iter_this;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  puVar1 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar3 = (source_location *)
           (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  location = (source_location *)
             (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar9 = ((long)puVar1 - (long)puVar2 >> 3) + -1;
  if (puVar1 == puVar2) {
    lVar9 = 0;
  }
  lVar12 = ((long)psVar3 - (long)location >> 3) + -1;
  if (psVar3 == location) {
    lVar12 = 0;
  }
  if ((lVar12 != lVar9) || (this->column_size != other->column_size)) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
    local_38 = &PTR_s__workspace_llm4binary_github_lic_0017bc60;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (Disa *)0x0,(Log_Level)&local_38,location);
    poVar8 = std::operator<<(poVar8,(string *)local_1a8);
    puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    if (puVar1 != puVar2) {
      uVar11 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_d8,uVar11);
    std::operator+(&local_b8,"Incompatible other dimensions, ",&local_d8);
    std::operator+(&local_98,&local_b8,",");
    std::__cxx11::to_string(&local_f8,this->column_size);
    std::operator+(&local_78,&local_98,&local_f8);
    std::operator+(&local_58,&local_78," vs. ");
    puVar1 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    if (puVar1 != puVar2) {
      uVar11 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_118,uVar11);
    std::operator+(&local_178,&local_58,&local_118);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter_this,
                   &local_178,",");
    std::__cxx11::to_string(&local_138,other->column_size);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter_this,
                   &local_138);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                   ".");
    poVar8 = std::operator<<(poVar8,(string *)local_1e8);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&iter_this);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_1a8);
    exit(1);
  }
  begin((Matrix_Sparse *)&iter_this);
  local_180 = other;
  cVar14 = begin(other);
  pdVar13 = (double *)cVar14.matrix_row.row_index;
  pMVar7 = cVar14.matrix_row.matrix;
  do {
    vVar4.row_index = (size_t)pdVar13;
    vVar4.matrix = pMVar7;
    vVar15 = (value_type)end(local_180);
    if (vVar15 == vVar4) {
      return this;
    }
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin((iterator *)local_1e8,&iter_this.matrix_row);
    local_1a8._0_8_ = pMVar7;
    local_1a8._8_8_ = pdVar13;
    Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::begin
              (&local_1c8,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_1a8);
    while( true ) {
      local_178._M_dataplus._M_p = (pointer)pMVar7;
      local_178._M_string_length = (size_type)pdVar13;
      Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
                ((iterator *)local_1a8,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_178);
      bVar6 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                        (&local_1c8,
                         (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1a8);
      if (!bVar6) break;
      Matrix_Sparse_Row<Disa::Matrix_Sparse>::end((iterator *)local_1a8,&iter_this.matrix_row);
      if (((((local_1e8._24_8_ == local_1a8._24_8_) && (local_1e8._16_8_ == local_1a8._16_8_)) &&
           (local_1e8._0_8_ == local_1a8._0_8_)) && (local_1e8._8_8_ == local_1a8._8_8_)) ||
         ((pointer)*local_1c8.column_index < *(pointer *)local_1e8._0_8_)) {
        local_178._M_dataplus._M_p = (pointer)*local_1c8.value;
        insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_1a8,
               this,&local_1c8.row_index,local_1c8.column_index,(double *)&local_178);
        local_1e8._16_8_ = local_1a8._16_8_;
        local_1e8._24_8_ = local_1a8._24_8_;
        local_1e8._0_8_ = local_1a8._0_8_;
        local_1e8._8_8_ = local_1a8._8_8_;
LAB_001315de:
        local_1c8.column_index = local_1c8.column_index + 1;
        local_1e8._8_8_ = local_1e8._8_8_ + 8;
        piVar5 = &local_1c8;
        pvVar10 = local_1c8.value;
      }
      else {
        if ((pointer)*local_1c8.column_index <= *(pointer *)local_1e8._0_8_) {
          *(double *)local_1e8._8_8_ = *local_1c8.value + *(double *)local_1e8._8_8_;
          goto LAB_001315de;
        }
        piVar5 = (iterator *)local_1e8;
        pvVar10 = (pointer)local_1e8._8_8_;
      }
      local_1e8._0_8_ =
           &(((Matrix_Sparse *)local_1e8._0_8_)->row_non_zero).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
      piVar5->value = pvVar10 + 1;
    }
    iter_this.matrix_row.row_index = iter_this.matrix_row.row_index + 1;
    pdVar13 = (double *)((long)pdVar13 + 1);
  } while( true );
}

Assistant:

Matrix_Sparse& Matrix_Sparse::matrix_arithmetic(const Matrix_Sparse& other) {
  ASSERT_DEBUG(size_row() == other.size_row() && size_column() == other.size_column(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");

  bool insert_state;
  iterator iter_this = begin();
  const_iterator iter_other = other.begin();
  while(iter_other != other.end()) {
    auto iter_element_this = iter_this->begin();
    const_iterator_element iter_element_other = (*iter_other).begin();
    while(iter_element_other != (*iter_other).end()) {
      if(iter_element_this == iter_this->end() || iter_element_this.i_column() > iter_element_other.i_column()) {
        std::tie(iter_element_this, insert_state) = insert(iter_element_other.i_row(), iter_element_other.i_column(),
                                                           _is_add ? (*iter_element_other) : -(*iter_element_other));
        ++iter_element_this;
        ++iter_element_other;
      } else if(iter_element_this.i_column() < iter_element_other.i_column()) {
        ++iter_element_this;
      } else {
        *iter_element_this += _is_add ? (*iter_element_other) : -(*iter_element_other);
        ++iter_element_this;
        ++iter_element_other;
      }
    }
    ++iter_this;
    ++iter_other;
  }
  return *this;
}